

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O3

CNodeState **
inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
          (CNodeState **val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view func_00;
  string_view file_00;
  size_t sVar2;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  char *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*val == (CNodeState *)0x0) {
    strlen((char *)CONCAT44(in_register_00000014,line));
    sVar2 = strlen(func);
    file_00._M_str = func;
    file_00._M_len = sVar2;
    func_00._M_str = in_stack_ffffffffffffffb8;
    func_00._M_len = (size_t)func;
    assertion_fail(file_00,(int)(sVar2 >> 0x20),func_00,in_stack_00000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}